

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O0

void utf8IteratorSetState(UCharIterator *iter,uint32_t state,UErrorCode *pErrorCode)

{
  byte bVar1;
  uint32_t uVar2;
  UBool UVar3;
  uint32_t uVar4;
  uint uVar5;
  uint local_28;
  int local_24;
  UChar32 c;
  int32_t index;
  UErrorCode *pErrorCode_local;
  UCharIterator *pUStack_10;
  uint32_t state_local;
  UCharIterator *iter_local;
  
  if ((pErrorCode != (UErrorCode *)0x0) &&
     (_c = pErrorCode, pErrorCode_local._4_4_ = state, pUStack_10 = iter,
     UVar3 = U_FAILURE(*pErrorCode), uVar2 = pErrorCode_local._4_4_, UVar3 == '\0')) {
    if (pUStack_10 == (UCharIterator *)0x0) {
      *_c = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      uVar4 = utf8IteratorGetState(pUStack_10);
      if (uVar2 != uVar4) {
        uVar5 = pErrorCode_local._4_4_ >> 1;
        pErrorCode_local._4_4_ = pErrorCode_local._4_4_ & 1;
        if (((pErrorCode_local._4_4_ == 0) || (3 < uVar5)) && ((int)uVar5 <= pUStack_10->limit)) {
          pUStack_10->start = uVar5;
          if (uVar5 < 2) {
            pUStack_10->index = uVar5;
          }
          else {
            pUStack_10->index = -1;
          }
          if (pErrorCode_local._4_4_ == 0) {
            pUStack_10->reservedField = 0;
          }
          else {
            local_24 = uVar5 - 1;
            bVar1 = *(byte *)((long)pUStack_10->context + (long)local_24);
            local_28 = (uint)bVar1;
            if ((bVar1 & 0x80) != 0) {
              local_28 = utf8_prevCharSafeBody_63
                                   ((uint8_t *)pUStack_10->context,0,&local_24,local_28,-3);
            }
            if ((int)local_28 < 0x10000) {
              *_c = U_INDEX_OUTOFBOUNDS_ERROR;
            }
            else {
              pUStack_10->reservedField = local_28;
            }
          }
        }
        else {
          *_c = U_INDEX_OUTOFBOUNDS_ERROR;
        }
      }
    }
  }
  return;
}

Assistant:

static void U_CALLCONV
utf8IteratorSetState(UCharIterator *iter,
                     uint32_t state,
                     UErrorCode *pErrorCode)
{
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        /* do nothing */
    } else if(iter==NULL) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
    } else if(state==utf8IteratorGetState(iter)) {
        /* setting to the current state: no-op */
    } else {
        int32_t index=(int32_t)(state>>1); /* UTF-8 index */
        state&=1; /* 1 if in surrogate pair, must be index>=4 */

        if((state==0 ? index<0 : index<4) || iter->limit<index) {
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        } else {
            iter->start=index; /* restore UTF-8 byte index */
            if(index<=1) {
                iter->index=index;
            } else {
                iter->index=-1; /* unknown UTF-16 index */
            }
            if(state==0) {
                iter->reservedField=0;
            } else {
                /* verified index>=4 above */
                UChar32 c;
                U8_PREV_OR_FFFD((const uint8_t *)iter->context, 0, index, c);
                if(c<=0xffff) {
                    *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                } else {
                    iter->reservedField=c;
                }
            }
        }
    }
}